

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O1

void GenCodeCmdSetRange(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  char *pcVar1;
  uchar uVar2;
  uint uVar3;
  int iVar4;
  char *pcVar5;
  char cVar6;
  x86Size size;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined8 unaff_RBX;
  undefined1 *puVar10;
  ulong uVar11;
  uint shift;
  x86Command op;
  uint *unaff_RBP;
  x86Reg in_R8D;
  uint in_R9D;
  uint shift_00;
  long unaff_R12;
  uint unaff_R13D;
  x86Command op_00;
  undefined8 unaff_R14;
  int *unaff_R15;
  undefined2 in_CS;
  longdouble in_ST0;
  undefined1 auStack_28 [8];
  
  puVar10 = auStack_28;
  if (5 < cmd.rB) {
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGenRegVm_X86.cpp"
                  ,0x614,"void GenCodeCmdSetRange(CodeGenRegVmContext &, RegVmCmd)");
  }
  pcVar5 = (char *)((ulong)cmd >> 8);
  uVar7 = (ulong)cmd >> 0x10 & 0xff;
  lVar8 = (long)(int)(&switchD_002b7b1e::switchdataD_003749b0)[uVar7];
  lVar9 = (long)&switchD_002b7b1e::switchdataD_003749b0 + lVar8;
  uVar2 = cmd.rA;
  op_00 = cmd._0_4_;
  cVar6 = (char)((ulong)ctx >> 8);
  shift = (uint)unaff_RBP;
  size = (x86Size)lVar9;
  shift_00 = (uint)unaff_R12;
  uVar3 = cmd._1_4_;
  switch(uVar7) {
  default:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEBX,(uVar3 & 0xff) << 3);
    op = o_rep_stosq;
    break;
  case 1:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_cvtsd2ss,rXMM0,sQWORD,rEBX,(uVar3 & 0xff) << 3);
    EMIT_OP_REG_REG(&ctx->ctx,o_movd,rEAX,rXMM0);
    goto LAB_002b7bdb;
  case 3:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar3 & 0xff) << 3);
LAB_002b7bdb:
    op = o_rep_stosd;
    break;
  case 4:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar3 & 0xff) << 3);
    op = o_rep_stosw;
    break;
  case 5:
    EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEAX,sDWORD,rEBX,(uVar3 & 0xff) << 3);
    op = o_rep_stosb;
    break;
  case 6:
    UINT_003749b4._0_1_ = 0xce;
    halt_baddata();
  case 7:
    UINT_003749b4._0_1_ = cVar6 + -0x32;
    EMIT_OP_RPTR_NUM(&ctx->ctx,op_00,0x3749b0,rEBP,shift,in_R9D);
    ctx = (CodeGenRegVmContext *)&(ctx->ctx).x86Base;
    goto LAB_002b84e1;
  case 8:
    pcVar5 = (char *)(lVar8 + 0x3749a7 + lVar9 * 4);
    *pcVar5 = *pcVar5 + (char)lVar9;
    EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
    ctx = (CodeGenRegVmContext *)&(ctx->ctx).x86LookBehind;
    EMIT_OP_REG_NUM((CodeGenGenericContext *)cmd,o_add64,rESI,(uint)unaff_R15);
    EMIT_OP_REG_RPTR((CodeGenGenericContext *)cmd,o_lea,rEDI,sQWORD,rEBP,shift);
    EMIT_OP_REG_NUM((CodeGenGenericContext *)cmd,o_mov,rECX,unaff_R13D >> 2);
    EMIT_OP((CodeGenGenericContext *)cmd,o_rep_movsd);
    goto LAB_002b84e1;
  case 9:
    *pcVar5 = *pcVar5 + uVar2;
    pcVar5 = (char *)((long)&UINT_003749b4 + lVar8 + 3);
    *pcVar5 = *pcVar5 + cVar6;
    EMIT_OP_RPTR_NUM(&ctx->ctx,op_00,0x3749b0,size,shift,in_R9D);
    goto LAB_002b84e1;
  case 10:
    *pcVar5 = *pcVar5 + uVar2;
    pcVar5 = (char *)((long)&UINT_003749b4 + lVar8 + 3);
    *pcVar5 = *pcVar5 + cVar6;
    EMIT_OP_RPTR_REG(&ctx->ctx,op_00,0x3749b0,size,shift,rEAX);
LAB_002b84e1:
    while( true ) {
      iVar4 = *(int *)&(ctx->ctx).x86Op;
      if (iVar4 == 1) {
        EMIT_OP_REG_RPTR((CodeGenGenericContext *)cmd,o_mov64,rEDX,sQWORD,rR13,0x120);
        EMIT_OP_RPTR_NUM((CodeGenGenericContext *)cmd,o_mov,sDWORD,rEDX,0,
                         *(int *)((long)cmd + 0xa20) + 1);
        EMIT_OP_RPTR_NUM((CodeGenGenericContext *)cmd,o_add64,sQWORD,rR13,0x120,4);
        return;
      }
      uVar3 = iVar4 - 2;
      if (uVar3 < 5) break;
      ctx = (CodeGenRegVmContext *)((long)&(ctx->ctx).x86Op + 4);
    }
    (*(code *)(*(int *)(unaff_R12 + (ulong)uVar3 * 4) + unaff_R12))();
    return;
  case 0xb:
    iVar4 = *unaff_R15;
    if (iVar4 != 7) {
      unaff_RBP = &switchD_002b90cc::switchdataD_003749dc;
      do {
        if (iVar4 - 2U < 5) {
          (*(code *)((long)(int)unaff_RBP[iVar4 - 2U] + (long)unaff_RBP))();
          return;
        }
        unaff_R15 = unaff_R15 + 1;
LAB_002b92ab:
        iVar4 = *unaff_R15;
      } while (iVar4 != 7);
    }
    if ((char)((ulong)unaff_R14 >> 0x18) != '\0') {
      EMIT_OP_REG_NUM64(&ctx->ctx,o_mov64,rEDI,(unsigned_long_long)ctx->vmState);
      EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rESI,rR15);
      EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEDX,(uint)unaff_RBX);
      EMIT_REG_READ(&ctx->ctx,rESI);
      EMIT_REG_READ(&ctx->ctx,rEDX);
      EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xd8);
    }
    CodeGenGenericContext::KillEarlyUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    CodeGenGenericContext::KillLateUnreadRegVmRegisters
              (&ctx->ctx,ctx->exRegVmRegKillInfo + ctx->currInstructionRegKillOffset);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rEAX,(uint)((ulong)unaff_RBX >> 0x20));
    EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESP,0x28);
    EMIT_OP_REG(&ctx->ctx,o_pop,rR15);
    EMIT_OP_REG(&ctx->ctx,o_pop,rEBX);
    EMIT_OP(&ctx->ctx,o_ret);
    return;
  case 0xc:
    pcVar5 = (char *)((ulong)auStack_28 & 0xffffffff);
  case 0xe:
    *(char *)((long)unaff_RBP + -0x75) = *(char *)((long)unaff_RBP + -0x75) + (char)pcVar5;
    EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEBP,shift_00,in_R9D);
    goto LAB_002b92ab;
  case 0xd:
    "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
    [lVar8 + 0x1a] =
         "void EMIT_OP_RPTR_NUM(CodeGenGenericContext &, x86Command, x86Size, x86Reg, int, x86Reg, unsigned int, unsigned int)"
         [lVar8 + 0x1a] + uVar2;
    cVar6 = (char)lVar9 + *(char *)&(ctx->ctx).x86Op;
    lVar8 = CONCAT71((int7)((ulong)lVar9 >> 8),cVar6);
    *pcVar5 = *pcVar5 + uVar2;
    pcVar1 = (char *)(lVar8 + -0x7d);
    *pcVar1 = *pcVar1 + uVar2;
    *(int *)&(ctx->ctx).x86Op = *(int *)&(ctx->ctx).x86Op + (int)lVar8;
    *pcVar5 = *pcVar5 + uVar2;
    pcVar5[-0x77] = pcVar5[-0x77] + cVar6;
    *(long *)((long)cmd + 0x4d) = (long)ROUND(in_ST0);
    EMIT_OP_REG_REG(&ctx->ctx,op_00,rESI,rR15);
    unaff_R15 = unaff_R15 + 4;
    EMIT_OP_REG_NUM(&ctx->ctx,o_add64,rESI,unaff_R13D);
    EMIT_OP_REG_RPTR(&ctx->ctx,o_lea,rEDI,sQWORD,rEBP,shift_00);
    EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,(uint)((ulong)cmd >> 2) & 0x3fffffff);
    EMIT_OP(&ctx->ctx,o_rep_movsd);
    goto LAB_002b92ab;
  case 0xf:
    EMIT_OP_REG_RPTR(&ctx->ctx,op_00,0x3749b0,size,in_R8D,in_R9D);
    EMIT_OP_RPTR_REG(&ctx->ctx,o_mov,sDWORD,rEBP,shift_00,rEAX);
    goto LAB_002b92ab;
  case 0x10:
    uVar11 = (ulong)((x86Command)auStack_28 ^ op_00);
    puVar10 = (undefined1 *)(uVar11 - 8);
    *(undefined8 *)(uVar11 - 8) = 0xfff431cefff43170;
  case 0x11:
    *(undefined2 *)(puVar10 + -4) = in_CS;
    *(undefined4 *)(puVar10 + -8) = 0x3749c5;
    (*(code *)((long)&ctx[0x50190].ctx.memCache[0xf].address.ptrMult + 1))();
    halt_baddata();
  case 0x12:
    do {
    } while( true );
  }
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEDI,sQWORD,rEBX,op_00 >> 0x15 & 0xfffffff8);
  EMIT_OP_REG_NUM(&ctx->ctx,o_mov,rECX,cmd.argument);
  EMIT_OP(&ctx->ctx,op);
  return;
}

Assistant:

void GenCodeCmdSetRange(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
#if defined(_M_X64)
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load double value as long
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rREG, cmd.rA * 8); // Load long value
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosq);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRDI, sQWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#else
	switch(RegVmSetRangeType(cmd.rB))
	{
	case rvsrDouble:
	case rvsrLong:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8);
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rA * 8 + 4);

		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_RPTR(ctx.ctx, o_lea, rECX, sDWORD, rEDI, cmd.argument * 8);

		EMIT_LABEL(ctx.ctx, ctx.labelCount);
		EMIT_OP_REG_REG(ctx.ctx, o_cmp, rEDI, rECX);
		EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount + 1, true);

		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 0, rEAX);
		EMIT_OP_RPTR_REG(ctx.ctx, o_mov, sDWORD, rEDI, 4, rEDX);

		EMIT_OP_REG_NUM(ctx.ctx, o_add, rEDI, 8);
		EMIT_REG_READ(ctx.ctx, rEDI); // Mark that register is used (by next iteration)

		EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount, true);
		EMIT_LABEL(ctx.ctx, ctx.labelCount + 1);

		ctx.labelCount += 2;
		break;
	case rvsrFloat:
		EMIT_OP_REG_RPTR(ctx.ctx, o_cvtsd2ss, rXMM0, sQWORD, rREG, cmd.rA * 8); // Load double as float
		EMIT_OP_REG_REG(ctx.ctx, o_movd, rEAX, rXMM0); // Move to integer register
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrInt:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosd);
		break;
	case rvsrShort:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosw);
		break;
	case rvsrChar:
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rREG, cmd.rA * 8); // Load integer
		EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDI, sDWORD, rREG, cmd.rC * 8); // Load target pointer
		EMIT_OP_REG_NUM(ctx.ctx, o_mov, rECX, cmd.argument);
		EMIT_OP(ctx.ctx, o_rep_stosb);
		break;
	default:
		assert(!"unknown type");
	}
#endif
}